

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O0

void __thiscall
CTcSymLocal::gen_code_member
          (CTcSymLocal *this,int discard,CTcPrsNode *prop_expr,int prop_is_expr,int argc,int varargs
          ,CTcNamedArgs *named_args)

{
  undefined4 in_ECX;
  undefined8 in_RDX;
  int in_ESI;
  CTcPrsNode *in_RDI;
  undefined4 in_R8D;
  int in_R9D;
  uchar in_stack_000000cf;
  CTcGenTarg *in_stack_000000d0;
  int varargs_00;
  int in_stack_fffffffffffffff0;
  
  varargs_00 = (int)((ulong)in_RDX >> 0x20);
  (*(in_RDI->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[0x18])(in_RDI,0);
  if (in_R9D != 0) {
    CTcGenTarg::write_op(in_stack_000000d0,in_stack_000000cf);
  }
  CTcPrsNode::s_gen_member_rhs
            (varargs,in_RDI,in_ESI,in_stack_fffffffffffffff0,varargs_00,
             (CTcNamedArgs *)CONCAT44(in_ECX,in_R8D));
  return;
}

Assistant:

void CTcSymLocal::gen_code_member(
    int discard, CTcPrsNode *prop_expr, int prop_is_expr,
    int argc, int varargs, CTcNamedArgs *named_args)
{
    /* generate code to evaluate the local */
    gen_code(FALSE);

    /* if we have an argument counter, put it back on top */
    if (varargs)
        G_cg->write_op(OPC_SWAP);

    /* use the standard member generation */
    CTcPrsNode::s_gen_member_rhs(discard, prop_expr, prop_is_expr,
                                 argc, varargs, named_args);
}